

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void new_localvar(LexState *ls,TString *name,ravi_type_map tm,TString *usertype)

{
  int iVar1;
  FuncState *fs;
  Dyndata *pDVar2;
  Proto *o;
  byte bVar3;
  LocVar *pLVar4;
  Vardesc *block;
  long lVar5;
  ravi_type_map *prVar6;
  short sVar7;
  char *__assertion;
  
  fs = ls->fs;
  pDVar2 = ls->dyd;
  o = fs->f;
  iVar1 = o->sizelocvars;
  if (fs->nlocvars < iVar1) {
    pLVar4 = o->locvars;
  }
  else {
    pLVar4 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x20,0x7fff,"local variables")
    ;
    o->locvars = pLVar4;
    if (iVar1 < o->sizelocvars) {
      lVar5 = (long)o->sizelocvars - (long)iVar1;
      prVar6 = &pLVar4[iVar1].ravi_type_map;
      do {
        *(undefined8 *)(prVar6 + -2) = 0xffffffffffffffff;
        *prVar6 = 0xffffffff;
        ((LocVar *)(prVar6 + -6))->varname = (TString *)0x0;
        *(TString **)(prVar6 + -4) = (TString *)0x0;
        prVar6 = prVar6 + 8;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  sVar7 = fs->nlocvars;
  pLVar4[sVar7].varname = name;
  pLVar4[sVar7].ravi_type_map = tm;
  pLVar4[sVar7].usertype = usertype;
  if (((o->marked & 0x20) != 0) && ((name->marked & 0x18) != 0)) {
    if ((o->tt & 0xe) < 10) {
      if ((name->tt & 0xe) < 10) {
        luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)name);
        sVar7 = fs->nlocvars;
        goto LAB_0011f869;
      }
      __assertion = "(((varname)->tt) & 0x0F) < (9+1)";
    }
    else {
      __assertion = "(((f)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                  ,0x19e,"int registerlocalvar(LexState *, TString *, ravi_type_map, TString *)");
  }
LAB_0011f869:
  fs->nlocvars = sVar7 + 1;
  iVar1 = (pDVar2->actvar).n;
  if (0x7d < (iVar1 + 1) - fs->firstlocal) {
    errorlimit(fs,0x7d,"local variables");
  }
  block = (pDVar2->actvar).arr;
  if ((pDVar2->actvar).size < iVar1 + 2) {
    block = (Vardesc *)
            luaM_growaux_(ls->L,block,&(pDVar2->actvar).size,2,0x7fffffff,"local variables");
    (pDVar2->actvar).arr = block;
    iVar1 = (pDVar2->actvar).n;
  }
  block[iVar1].idx = sVar7;
  if (((byte)ravi_parser_debug & 4) == 0) {
    (pDVar2->actvar).n = iVar1 + 1;
  }
  else {
    raviY_printf(fs,"new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n"
                 ,fs->f->locvars + sVar7,(ulong)(uint)(int)sVar7);
    bVar3 = (byte)ravi_parser_debug & 4;
    (pDVar2->actvar).n = (pDVar2->actvar).n + 1;
    if (bVar3 != 0) {
      raviY_printf(fs,"new_localvar -> ls->dyd->actvar.n set to %d\n");
      return;
    }
  }
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, ravi_type_map tm, TString *usertype) {
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  /* register variable and get its index */
  /* RAVI change - record type info for local variable */
  int reg = registerlocalvar(ls, name, tm, usertype);
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                  MAXVARS, "local variables");
  luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, MAX_INT, "local variables");
  /* variable will be placed at stack position dyd->actvar.n */
  dyd->actvar.arr[dyd->actvar.n].idx = cast(short, reg);
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n", &fs->f->locvars[reg], reg, dyd->actvar.n));
  dyd->actvar.n++;
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> ls->dyd->actvar.n set to %d\n", dyd->actvar.n));
}